

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O0

Name __thiscall CFG::RelooperBuilder::getBlockBreakName(RelooperBuilder *this,int id)

{
  string local_c0;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  RelooperBuilder *pRStack_20;
  int id_local;
  RelooperBuilder *this_local;
  
  local_24 = id;
  pRStack_20 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"block$",&local_89);
  std::__cxx11::to_string(&local_c0,local_24);
  std::operator+(&local_68,&local_88,&local_c0);
  std::operator+(&local_48,&local_68,"$break");
  ::wasm::Name::Name((Name *)&this_local,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return (IString)(IString)_this_local;
}

Assistant:

wasm::Name getBlockBreakName(int id) {
    return wasm::Name(std::string("block$") + std::to_string(id) + "$break");
  }